

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioFeaturePrint.pb.cc
# Opt level: O0

bool CoreML::Specification::CoreMLModels::AudioFeaturePrint_Sound_SoundVersion_Parse
               (ConstStringParam name,AudioFeaturePrint_Sound_SoundVersion *value)

{
  bool bVar1;
  int *in_R9;
  StringPiece name_00;
  StringPiece local_30;
  AudioFeaturePrint_Sound_SoundVersion local_1c;
  bool success;
  AudioFeaturePrint_Sound_SoundVersion *pAStack_18;
  int int_value;
  AudioFeaturePrint_Sound_SoundVersion *value_local;
  ConstStringParam name_local;
  
  pAStack_18 = value;
  value_local = (AudioFeaturePrint_Sound_SoundVersion *)name;
  google::protobuf::stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
            (&local_30,name);
  name_00.length_ = (size_type)&local_1c;
  name_00.ptr_ = (char *)local_30.length_;
  bVar1 = google::protobuf::internal::LookUpEnumValue
                    ((internal *)AudioFeaturePrint_Sound_SoundVersion_entries,(EnumEntry *)0x2,
                     (size_t)local_30.ptr_,name_00,in_R9);
  if (bVar1) {
    *pAStack_18 = local_1c;
  }
  return bVar1;
}

Assistant:

bool AudioFeaturePrint_Sound_SoundVersion_Parse(
    ::PROTOBUF_NAMESPACE_ID::ConstStringParam name, AudioFeaturePrint_Sound_SoundVersion* value) {
  int int_value;
  bool success = ::PROTOBUF_NAMESPACE_ID::internal::LookUpEnumValue(
      AudioFeaturePrint_Sound_SoundVersion_entries, 2, name, &int_value);
  if (success) {
    *value = static_cast<AudioFeaturePrint_Sound_SoundVersion>(int_value);
  }
  return success;
}